

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::ifthenelse_else(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Cell CVar1;
  uint x;
  uint uVar2;
  uint uVar3;
  Cell i;
  int iVar4;
  
  this_00 = &this->controlStackIf_Begin;
  CVar1 = (this->controlStackIf_Begin).top;
  data(this,5);
  x = this->dataPointer;
  data(this,this->CellSize);
  if (CVar1 != 0) {
    uVar2 = ForthStack<unsigned_int>::getTop(this_00);
    uVar3 = this->dataPointer - uVar2;
    iVar4 = 0;
    do {
      dataSpaceSet(this,uVar2 + iVar4,(Char)uVar3);
      uVar3 = uVar3 >> 8;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 4);
    ForthStack<unsigned_int>::setTop(this_00,x);
    return;
  }
  ForthStack<unsigned_int>::push(this_00,x);
  return;
}

Assistant:

void ifthenelse_else() {
			auto controlStackSize = controlStackIf_Begin.stackDepth();
			data(branchXt);
			auto elseHere = getDataPointer();
			data(CellSize);
			if (controlStackSize > 0){
				auto ifHere = controlStackIf_Begin.getTop();
				setDataCell(ifHere, Cell(getDataPointer() - ifHere));
				controlStackIf_Begin.setTop(elseHere);
			}
			else {
				controlStackIf_Begin.push(elseHere); // else without forward reference
			}
		}